

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O1

void Map_NodeTransferArrivalTimes(Map_Man_t *p,Map_Node_t *pNode)

{
  Map_Cut_t *pMVar1;
  Map_Cut_t *pMVar2;
  Map_SuperLib_t *pMVar3;
  float fVar4;
  float fVar5;
  
  pMVar1 = pNode->pCutBest[0];
  if (pMVar1 != (Map_Cut_t *)0x0) {
    pMVar2 = pNode->pCutBest[1];
    if (pMVar2 != (Map_Cut_t *)0x0) {
      pNode->tArrival[0].Worst = pMVar1->M[0].tArrive.Worst;
      fVar5 = pMVar1->M[0].tArrive.Fall;
      pNode->tArrival[0].Rise = pMVar1->M[0].tArrive.Rise;
      pNode->tArrival[0].Fall = fVar5;
      fVar5 = pMVar2->M[1].tArrive.Fall;
      pNode->tArrival[1].Rise = pMVar2->M[1].tArrive.Rise;
      pNode->tArrival[1].Fall = fVar5;
      pNode->tArrival[1].Worst = pMVar2->M[1].tArrive.Worst;
      return;
    }
    if (pMVar1 != (Map_Cut_t *)0x0) {
      fVar5 = pMVar1->M[0].tArrive.Fall;
      pNode->tArrival[0].Rise = pMVar1->M[0].tArrive.Rise;
      pNode->tArrival[0].Fall = fVar5;
      pNode->tArrival[0].Worst = pMVar1->M[0].tArrive.Worst;
      pMVar3 = p->pSuperLib;
      fVar4 = pNode->tArrival[0].Fall + (pMVar3->tDelayInv).Rise;
      fVar5 = pNode->tArrival[0].Rise;
      pNode->tArrival[1].Rise = fVar4;
      fVar5 = fVar5 + (pMVar3->tDelayInv).Fall;
      pNode->tArrival[1].Fall = fVar5;
      if (fVar4 <= fVar5) {
        fVar4 = fVar5;
      }
      pNode->tArrival[1].Worst = fVar4;
      return;
    }
  }
  pMVar1 = pNode->pCutBest[1];
  if (pMVar1 != (Map_Cut_t *)0x0) {
    fVar5 = pMVar1->M[1].tArrive.Fall;
    pNode->tArrival[1].Rise = pMVar1->M[1].tArrive.Rise;
    pNode->tArrival[1].Fall = fVar5;
    pNode->tArrival[1].Worst = pMVar1->M[1].tArrive.Worst;
    pMVar3 = p->pSuperLib;
    fVar4 = pNode->tArrival[1].Fall + (pMVar3->tDelayInv).Rise;
    fVar5 = pNode->tArrival[1].Rise;
    pNode->tArrival[0].Rise = fVar4;
    fVar5 = fVar5 + (pMVar3->tDelayInv).Fall;
    pNode->tArrival[0].Fall = fVar5;
    if (fVar4 <= fVar5) {
      fVar4 = fVar5;
    }
    pNode->tArrival[0].Worst = fVar4;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperMatch.c"
                ,0x21b,"void Map_NodeTransferArrivalTimes(Map_Man_t *, Map_Node_t *)");
}

Assistant:

void Map_NodeTransferArrivalTimes( Map_Man_t * p, Map_Node_t * pNode )
{
    // if both phases are available, set their arrival times
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] )
    {
        pNode->tArrival[0] = pNode->pCutBest[0]->M[0].tArrive;
        pNode->tArrival[1] = pNode->pCutBest[1]->M[1].tArrive;
    }
    // if only one phase is available, compute the arrival time of other phase
    else if ( pNode->pCutBest[0] )
    {
        pNode->tArrival[0] = pNode->pCutBest[0]->M[0].tArrive;
        pNode->tArrival[1].Rise  = pNode->tArrival[0].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[1].Fall  = pNode->tArrival[0].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[1].Worst = MAP_MAX(pNode->tArrival[1].Rise, pNode->tArrival[1].Fall);
    }
    else if ( pNode->pCutBest[1] )
    {
        pNode->tArrival[1] = pNode->pCutBest[1]->M[1].tArrive;
        pNode->tArrival[0].Rise  = pNode->tArrival[1].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[0].Fall  = pNode->tArrival[1].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[0].Worst = MAP_MAX(pNode->tArrival[0].Rise, pNode->tArrival[0].Fall);
    }
    else 
    {
        assert( 0 );
    }

//    assert( pNode->tArrival[0].Rise < pNode->tRequired[0].Rise + p->fEpsilon );
//    assert( pNode->tArrival[0].Fall < pNode->tRequired[0].Fall + p->fEpsilon );

//    assert( pNode->tArrival[1].Rise < pNode->tRequired[1].Rise + p->fEpsilon );
//    assert( pNode->tArrival[1].Fall < pNode->tRequired[1].Fall + p->fEpsilon );
}